

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void ngai_nbgets(char *loc_base_ptr,char *prem,int *stride_rem,char *pbuf,int *stride_loc,int *count
                ,int nstrides,int proc,int field_off,int field_size,int type_size,
                armci_hdl_t *nbhandle)

{
  int *piVar1;
  long in_RCX;
  armci_hdl_t *in_RDX;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  int in_stack_00000008;
  int in_stack_00000020;
  int in_stack_00000028;
  int i;
  undefined8 in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  int iVar3;
  int *src_ptr;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if ((in_stack_00000020 < 0) || (in_stack_00000020 == in_stack_00000028)) {
    ARMCI_NbGetS(in_R9,(int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar3
                 ,(int)in_RCX,in_RDX);
  }
  else {
    src_ptr = in_R9 + -1;
    piVar1 = (int *)(in_R8 + -4);
    *in_R9 = *in_R9 / in_stack_00000028;
    for (iVar2 = 1; iVar2 < in_stack_00000008 + 1; iVar2 = iVar2 + 1) {
      piVar1[iVar2] = piVar1[iVar2] / in_stack_00000028;
      piVar1[iVar2] = in_stack_00000020 * piVar1[iVar2];
      in_stack_ffffffffffffffb0 = piVar1;
    }
    ARMCI_NbGetS(src_ptr,(int *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),src_ptr,in_RDI,
                 in_stack_ffffffffffffffb0,iVar3,
                 (int)in_RDI +
                 (int)((in_RCX - (long)in_RDI) / (long)in_stack_00000028) * in_stack_00000020,
                 in_RDX + -1);
    src_ptr[1] = in_stack_00000028 * src_ptr[1];
    for (iVar3 = 1; iVar3 < in_stack_00000008 + 1; iVar3 = iVar3 + 1) {
      piVar1[iVar3] = piVar1[iVar3] / in_stack_00000020;
      piVar1[iVar3] = in_stack_00000028 * piVar1[iVar3];
    }
  }
  return;
}

Assistant:

static void ngai_nbgets(char *loc_base_ptr, char *prem,int *stride_rem, char *pbuf, int *stride_loc,
			int *count, int nstrides, int proc, int field_off, 
			int field_size, int type_size, armci_hdl_t *nbhandle) {
  if(field_size<0 || field_size == type_size) {
    ARMCI_NbGetS(prem,stride_rem,pbuf,stride_loc,count,nstrides,proc,nbhandle);
  }
  else {
    int i;
    count -= 1;
    stride_loc -= 1;
    stride_rem -= 1;

    pbuf = loc_base_ptr + (pbuf - loc_base_ptr)/type_size*field_size;
    prem += field_off;

    count[1] /= type_size; 
    nstrides += 1;

    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= type_size;
      stride_loc[i] *= field_size;
    }
/*     { */
/*       int i; */
/*       printf("%s: calling armci_nbgets: field_off=%d field_size=%d type_size=%d proc=%d nstrides=%d\n",  */
/* 	     __FUNCTION__, (int)field_off, (int)field_size, (int)type_size, proc, nstrides); */
/*       printf("me=%d loc_ptr=%p rem_ptr=%p count=[", pnga_nodeid(), pbuf, prem); */
/*       for(i=0; i<=nstrides; i++) { */
/* 	printf("%d ",count[i]); */
/*       } */
/*       printf("]\n"); */
/*       printf("src_stride_arr=["); */
/*       for(i=0; i<nstrides; i++) { */
/* 	printf("%d ",stride_rem[i]); */
/*       } */
/*       printf("]\n"); */
/*       printf("dst_stride_arr=["); */
/*       for(i=0; i<nstrides; i++) { */
/* 	printf("%d ",stride_loc[i]); */
/*       } */
/*       printf("]\n"); */
/*     } */
    ARMCI_NbGetS(prem,stride_rem,pbuf,stride_loc,count,nstrides,proc,nbhandle);
    count[1] *= type_size; /*restore*/
    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= field_size;
      stride_loc[i] *= type_size;
    }
  }
}